

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O1

argParserAdvancedConfiguration * __thiscall
argParserAdvancedConfiguration::numberOfParameter(argParserAdvancedConfiguration *this,int number)

{
  ((this->newargconfig->
   super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
   )._M_impl.super__Vector_impl_data._M_finish[-1]->arguments->
  super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  )._M_impl.super__Vector_impl_data._M_finish[-1]->numberOfArguments = number;
  return this;
}

Assistant:

argParserAdvancedConfiguration *argParserAdvancedConfiguration::numberOfParameter(int number) {
    newargconfig->back()->arguments->back()->numberOfArguments = number;

    return this;
}